

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O2

void RuntimeManifestFile::CreateIfValid
               (string *filename,
               vector<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>,_std::allocator<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>_>_>
               *manifest_files)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  allocator local_469;
  Value root_node;
  CharReaderBuilder builder;
  string errors;
  string local_3e8;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_3c8;
  string local_3b0;
  ostringstream error_ss;
  ifstream json_stream;
  
  std::ifstream::ifstream(&json_stream,(string *)filename,_S_in);
  std::__cxx11::string::string((string *)&error_ss,"",(allocator *)&errors);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builder,
                 "RuntimeManifestFile::CreateIfValid - attempting to load ",filename);
  root_node.value_.int_ = 0;
  root_node.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
  root_node._12_4_ = 0;
  root_node.comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
          )0x0;
  LoaderLogger::LogInfoMessage
            ((string *)&error_ss,(string *)&builder,
             (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&root_node);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
            ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&root_node);
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::~string((string *)&error_ss);
  std::__cxx11::string::string
            ((string *)&builder,"RuntimeManifestFile::CreateIfValid ",(allocator *)&root_node);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_ss,(string *)&builder,_S_out);
  std::__cxx11::string::~string((string *)&builder);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&error_ss,"failed to open ");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    std::operator<<(poVar3,".  Does it exist?");
    std::__cxx11::string::string((string *)&builder,"",(allocator *)&local_3e8);
    std::__cxx11::stringbuf::str();
    errors._M_dataplus._M_p = (pointer)0x0;
    errors._M_string_length = 0;
    errors.field_2._M_allocated_capacity = 0;
    LoaderLogger::LogErrorMessage
              ((string *)&builder,(string *)&root_node,
               (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&errors);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
              ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&errors);
    std::__cxx11::string::~string((string *)&root_node);
    std::__cxx11::string::~string((string *)&builder);
    goto LAB_0011216c;
  }
  Json::CharReaderBuilder::CharReaderBuilder(&builder);
  errors._M_dataplus._M_p = (pointer)&errors.field_2;
  errors._M_string_length = 0;
  errors.field_2._M_allocated_capacity = errors.field_2._M_allocated_capacity & 0xffffffffffffff00;
  Json::Value::Value(&root_node,nullValue);
  bVar2 = Json::parseFromStream(&builder.super_Factory,(IStream *)&json_stream,&root_node,&errors);
  if (bVar2) {
    bVar2 = Json::Value::isObject(&root_node);
    if (!bVar2) goto LAB_00112057;
    CreateIfValid(&root_node,filename,manifest_files);
  }
  else {
LAB_00112057:
    poVar3 = std::operator<<((ostream *)&error_ss,"failed to parse ");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    std::operator<<(poVar3,".");
    if (errors._M_string_length != 0) {
      poVar3 = std::operator<<((ostream *)&error_ss," (Error message: ");
      poVar3 = std::operator<<(poVar3,(string *)&errors);
      std::operator<<(poVar3,")");
    }
    std::operator<<((ostream *)&error_ss," Is it a valid runtime manifest file?");
    std::__cxx11::string::string((string *)&local_3e8,"",&local_469);
    std::__cxx11::stringbuf::str();
    local_3c8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3c8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3c8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogErrorMessage(&local_3e8,&local_3b0,&local_3c8);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_3c8);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3e8);
  }
  Json::Value::~Value(&root_node);
  std::__cxx11::string::~string((string *)&errors);
  Json::CharReaderBuilder::~CharReaderBuilder(&builder);
LAB_0011216c:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_ss);
  std::ifstream::~ifstream(&json_stream);
  return;
}

Assistant:

void RuntimeManifestFile::CreateIfValid(std::string const &filename,
                                        std::vector<std::unique_ptr<RuntimeManifestFile>> &manifest_files) {
    std::ifstream json_stream(filename, std::ifstream::in);

    LoaderLogger::LogInfoMessage("", "RuntimeManifestFile::CreateIfValid - attempting to load " + filename);
    std::ostringstream error_ss("RuntimeManifestFile::CreateIfValid ");
    if (!json_stream.is_open()) {
        error_ss << "failed to open " << filename << ".  Does it exist?";
        LoaderLogger::LogErrorMessage("", error_ss.str());
        return;
    }
    Json::CharReaderBuilder builder;
    std::string errors;
    Json::Value root_node = Json::nullValue;
    if (!Json::parseFromStream(builder, json_stream, &root_node, &errors) || !root_node.isObject()) {
        error_ss << "failed to parse " << filename << ".";
        if (!errors.empty()) {
            error_ss << " (Error message: " << errors << ")";
        }
        error_ss << " Is it a valid runtime manifest file?";
        LoaderLogger::LogErrorMessage("", error_ss.str());
        return;
    }

    CreateIfValid(root_node, filename, manifest_files);
}